

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O0

void pztopology::TPZLine::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  int64_t in_RDX;
  TPZFMatrix<double> *in_RSI;
  TPZVec<double> *in_RDI;
  double dVar2;
  double x;
  double col;
  
  pdVar1 = TPZVec<double>::operator[](in_RDI,0);
  col = *pdVar1;
  dVar2 = 1.0 - col;
  pdVar1 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)col);
  *pdVar1 = dVar2 / 2.0;
  dVar2 = col + 1.0;
  pdVar1 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)col);
  *pdVar1 = dVar2 / 2.0;
  pdVar1 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)col);
  *pdVar1 = -0.5;
  pdVar1 = TPZFMatrix<double>::operator()(in_RSI,in_RDX,(int64_t)col);
  *pdVar1 = 0.5;
  return;
}

Assistant:

inline void TPZLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T x = loc[0];
        phi(0,0) = (1.0-x)/2.;
        phi(1,0) = (1.0+x)/2.;
        dphi(0,0) = -0.5;
        dphi(0,1) = 0.5;
    }